

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

void post(QUEUE *q,uv__work_kind kind)

{
  QUEUE *papvVar1;
  
  uv_mutex_lock(&mutex);
  papvVar1 = q;
  if (kind == UV__WORK_SLOW_IO) {
    (*q)[0] = slow_io_pending_wq;
    (*q)[1] = slow_io_pending_wq[1];
    *(QUEUE **)slow_io_pending_wq[1] = q;
    papvVar1 = &run_slow_work_message;
    slow_io_pending_wq[1] = q;
    if ((void **)run_slow_work_message[0] != run_slow_work_message) goto LAB_0011698f;
  }
  (*papvVar1)[0] = wq;
  (*papvVar1)[1] = wq[1];
  *(QUEUE **)wq[1] = papvVar1;
  wq[1] = papvVar1;
  if (idle_threads != 0) {
    uv_cond_signal(&cond);
  }
LAB_0011698f:
  uv_mutex_unlock(&mutex);
  return;
}

Assistant:

static void post(QUEUE* q, enum uv__work_kind kind) {
  uv_mutex_lock(&mutex);
  if (kind == UV__WORK_SLOW_IO) {
    /* Insert into a separate queue. */
    QUEUE_INSERT_TAIL(&slow_io_pending_wq, q);
    if (!QUEUE_EMPTY(&run_slow_work_message)) {
      /* Running slow I/O tasks is already scheduled => Nothing to do here.
         The worker that runs said other task will schedule this one as well. */
      uv_mutex_unlock(&mutex);
      return;
    }
    q = &run_slow_work_message;
  }

  QUEUE_INSERT_TAIL(&wq, q);
  if (idle_threads > 0)
    uv_cond_signal(&cond);
  uv_mutex_unlock(&mutex);
}